

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

void __thiscall
apngasm::APNGAsm::APNGAsm
          (APNGAsm *this,vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_> *frames)

{
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<apngasm::APNGFrame_*,_std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>_>
  local_28;
  const_iterator local_20;
  vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_> *local_18;
  vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_> *frames_local;
  APNGAsm *this_local;
  
  local_18 = frames;
  frames_local = &this->_frames;
  std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::vector(&this->_frames);
  this->_loops = 0;
  this->_skipFirst = false;
  this->_listener = (IAPNGAsmListener *)&::(anonymous_namespace)::defaultListener;
  std::vector<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>::vector(&this->_info_chunks);
  local_28._M_current =
       (APNGFrame *)
       std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::end(&this->_frames);
  __gnu_cxx::
  __normal_iterator<apngasm::APNGFrame_const*,std::vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>>>
  ::__normal_iterator<apngasm::APNGFrame*>
            ((__normal_iterator<apngasm::APNGFrame_const*,std::vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>>>
              *)&local_20,&local_28);
  __first = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::begin(local_18);
  __last = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::end(local_18);
  std::vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>>::
  insert<__gnu_cxx::__normal_iterator<apngasm::APNGFrame_const*,std::vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>>>,void>
            ((vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>> *)this,local_20,
             (__normal_iterator<const_apngasm::APNGFrame_*,_std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>_>
              )__first._M_current,
             (__normal_iterator<const_apngasm::APNGFrame_*,_std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>_>
              )__last._M_current);
  return;
}

Assistant:

APNGAsm::APNGAsm(const std::vector<APNGFrame> &frames)
    : _listener(&defaultListener)
    , _loops(0)
    , _skipFirst(false)
  {
    _frames.insert(_frames.end(), frames.begin(), frames.end());
  }